

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O3

int handle_timeo(long currcms)

{
  uint uVar1;
  __u8 _Var2;
  __u8 _Var3;
  __u8 _Var4;
  __u8 _Var5;
  byte bVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  size_t __n;
  long lVar12;
  canfd_frame *pcVar13;
  char *__format;
  long lVar14;
  canfd_frame *pcVar15;
  undefined8 uVar16;
  snif *psVar17;
  byte bVar18;
  
  bVar6 = clearscreen;
  bVar18 = 0;
  if (clearscreen == 0) {
    if (print_eff == '\x01') {
      uVar16 = 0x23;
      if (name_sep != '\0') {
        uVar16 = 0x2a;
      }
      __format = "%s%sXX|ms%s-- ID --%sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >";
      pcVar9 = vdl;
    }
    else {
      uVar16 = 0x23;
      if (name_sep != '\0') {
        uVar16 = 0x2a;
      }
      __format = "%s%sXX|ms%sID %sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >";
      pcVar9 = " | ";
    }
    printf(__format,"\x1b[2J","\x1b[H",pcVar9,pcVar9,interface,uVar16,loop,hold,timeout,
           (ulong)(uint)idx);
    clearscreen = 1;
  }
  if (notch == '\x01') {
    lVar8 = (long)idx;
    if (0 < lVar8) {
      lVar10 = 8;
      if (max_dlen != '\0') {
        lVar10 = 0x40;
      }
      lVar11 = 0x107298;
      lVar12 = 0;
      do {
        lVar14 = 0;
        do {
          *(byte *)(lVar11 + lVar14) =
               *(byte *)(lVar11 + lVar14) | *(byte *)(lVar11 + -0x48 + lVar14);
          lVar14 = lVar14 + 1;
        } while (lVar10 != lVar14);
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0x158;
      } while (lVar12 != lVar8);
    }
    notch = '\0';
  }
  printf("%s","\x1b[H");
  handle_timeo::frame_count = handle_timeo::frame_count + 1;
  printf("%02d\n");
  handle_timeo::frame_count = handle_timeo::frame_count % 100;
  if (0 < idx) {
    psVar17 = sniftab;
    lVar8 = 0;
    iVar7 = idx;
    do {
      uVar1 = psVar17->flags;
      if ((uVar1 & 1) != 0) {
        if ((uVar1 & 2) != 0) {
          if ((bVar6 & (uVar1 & 4) == 0) == 0) {
            print_snifline((int)lVar8);
            psVar17->hold = hold + currcms;
            *(byte *)&psVar17->flags = (byte)psVar17->flags & 0xfb;
          }
          else if (psVar17->hold < currcms && psVar17->hold != 0) {
            __n = 8;
            if (max_dlen != '\0') {
              __n = 0x40;
            }
            memset((psVar17->marker).data,0,__n);
            print_snifline((int)lVar8);
            psVar17->hold = 0;
          }
          else {
            printf("%s","\x1b[B");
          }
          if (psVar17->timeout < currcms && psVar17->timeout != 0) {
            *(byte *)&psVar17->flags = (byte)psVar17->flags & 0xf9;
            clearscreen = 0;
          }
        }
        pcVar13 = &psVar17->current;
        pcVar15 = &psVar17->last;
        for (lVar10 = 9; iVar7 = idx, lVar10 != 0; lVar10 = lVar10 + -1) {
          _Var2 = pcVar13->len;
          _Var3 = pcVar13->flags;
          _Var4 = pcVar13->__res0;
          _Var5 = pcVar13->__res1;
          pcVar15->can_id = pcVar13->can_id;
          pcVar15->len = _Var2;
          pcVar15->flags = _Var3;
          pcVar15->__res0 = _Var4;
          pcVar15->__res1 = _Var5;
          pcVar13 = (canfd_frame *)((long)pcVar13 + ((ulong)bVar18 * -4 + 2) * 4);
          pcVar15 = (canfd_frame *)((long)pcVar15 + ((ulong)bVar18 * -4 + 2) * 4);
        }
      }
      lVar8 = lVar8 + 1;
      psVar17 = psVar17 + 1;
    } while (lVar8 < iVar7);
  }
  return 1;
}

Assistant:

int handle_timeo(long currcms)
{
	int i, j;
	int force_redraw = 0;
	static unsigned int frame_count;

	if (clearscreen) {
		if (print_eff)
			printf("%s%sXX|ms%s-- ID --%sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >",
			       CLR_SCREEN, CSR_HOME, vdl, vdl, interface, name_sep, loop, hold, timeout, idx);
		else
			printf("%s%sXX|ms%sID %sdata ...     < %s %c l=%ld h=%ld t=%ld slots=%d >",
			       CLR_SCREEN, CSR_HOME, ldl, ldl, interface, name_sep, loop, hold, timeout, idx);

		force_redraw = 1;
		clearscreen = 0;
	}

	if (notch) {
		for (i = 0; i < idx; i++) {
			for (j = 0; j < max_dlen; j++)
				sniftab[i].notch.data[j] |= sniftab[i].marker.data[j];
		}
		notch = 0;
	}

	printf("%s", CSR_HOME);
	printf("%02d\n", frame_count++); /* rolling display update counter */
	frame_count %= 100;

	for (i = 0; i < idx; i++) {
		if is_set(i, ENABLE) {
				if is_set(i, DISPLAY) {
						if (is_set(i, UPDATE) || (force_redraw)) {
							print_snifline(i);
							sniftab[i].hold = currcms + hold;
							do_clr(i, UPDATE);
						}
						else  if ((sniftab[i].hold) && (sniftab[i].hold < currcms)) {
								memset(&sniftab[i].marker.data, 0, max_dlen);
								print_snifline(i);
								sniftab[i].hold = 0; /* disable update by hold */
							}
						else
							printf("%s", CSR_DOWN); /* skip my line */

						if (sniftab[i].timeout && sniftab[i].timeout < currcms) {
							do_clr(i, DISPLAY);
							do_clr(i, UPDATE);
							clearscreen = 1; /* removed entry -> new drawing next time */
						}
					}
				sniftab[i].last      = sniftab[i].current;
			}
	}

	return 1; /* ok */
}